

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noisy_laser_tag.cpp
# Opt level: O0

double __thiscall
despot::NoisyLaserTag::ObsProb(NoisyLaserTag *this,OBS_TYPE obs,State *state,ACT_TYPE action)

{
  int iVar1;
  const_reference pvVar2;
  const_reference this_00;
  const_reference this_01;
  const_reference pvVar3;
  double dVar4;
  NoisyLaserTag *local_60;
  double prob_mass;
  int reading;
  int dir;
  double prod;
  ACT_TYPE action_local;
  State *state_local;
  OBS_TYPE obs_local;
  NoisyLaserTag *this_local;
  
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     (&(this->super_BaseTag).rob_,(long)*(int *)(state + 0xc));
  iVar1 = *pvVar2;
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     (&(this->super_BaseTag).opp_,(long)*(int *)(state + 0xc));
  if (iVar1 == *pvVar2) {
    local_60 = (NoisyLaserTag *)0x3ff0000000000000;
    if (obs != (this->super_BaseTag).same_loc_obs_) {
      local_60 = (NoisyLaserTag *)0x0;
    }
    this_local = local_60;
  }
  else {
    _reading = (NoisyLaserTag *)0x3ff0000000000000;
    for (prob_mass._4_4_ = 0; prob_mass._4_4_ < NBEAMS; prob_mass._4_4_ = prob_mass._4_4_ + 1) {
      iVar1 = GetReading(obs,(long)prob_mass._4_4_);
      dVar4 = LaserRange(this,state,prob_mass._4_4_);
      if (dVar4 / this->unit_size_ <= (double)iVar1) {
        return 0.0;
      }
      this_00 = std::
                vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                ::operator[](&this->reading_distributions_,(long)*(int *)(state + 0xc));
      this_01 = std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::operator[](this_00,(long)prob_mass._4_4_);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](this_01,(long)iVar1);
      _reading = (NoisyLaserTag *)(*pvVar3 * (double)_reading);
    }
    this_local = _reading;
  }
  return (double)this_local;
}

Assistant:

double NoisyLaserTag::ObsProb(OBS_TYPE obs, const State& state, ACT_TYPE action) const {
	if (rob_[state.state_id] == opp_[state.state_id])
		return obs == same_loc_obs_;

	double prod = 1.0;
	for (int dir = 0; dir < NBEAMS; dir++) {
		int reading = GetReading(obs, dir);
		if (reading >= LaserRange(state, dir) / unit_size_)
			return 0;
		double prob_mass = reading_distributions_[state.state_id][dir][reading];
		prod *= prob_mass;
	}

	return prod;
}